

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderLayeredRenderingBoundaryConditionVariousTextures::
GeometryShaderLayeredRenderingBoundaryConditionVariousTextures
          (GeometryShaderLayeredRenderingBoundaryConditionVariousTextures *this,Context *context,
          ExtParameters *extParams,char *name,char *description)

{
  vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
  *this_00;
  pointer *ppTVar1;
  iterator iVar2;
  TextureInfo local_28;
  
  GeometryShaderLayeredRenderingBoundaryCondition::GeometryShaderLayeredRenderingBoundaryCondition
            (&this->super_GeometryShaderLayeredRenderingBoundaryCondition,context,extParams,name,
             description);
  (this->super_GeometryShaderLayeredRenderingBoundaryCondition).super_TestCaseBase.super_TestCase.
  super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GeometryShaderLayeredRenderingBoundaryCondition_02105190;
  local_28.m_depth = 2;
  local_28.m_draw_buffer = 0x8ce0;
  local_28.m_id = 0;
  local_28.m_texture_target = 0x806f;
  this_00 = &(this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_textures_info;
  iVar2._M_current =
       (this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_textures_info.
       super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_textures_info.
      super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>>
    ::_M_realloc_insert<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo_const&>
              ((vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>>
                *)this_00,iVar2,&local_28);
    iVar2._M_current =
         (this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_textures_info.
         super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar2._M_current)->m_depth = 2;
    (iVar2._M_current)->m_draw_buffer = 0x8ce0;
    (iVar2._M_current)->m_id = 0;
    (iVar2._M_current)->m_texture_target = 0x806f;
    iVar2._M_current =
         (this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_textures_info.
         super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_textures_info.
    super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_28.m_depth = 4;
  local_28.m_draw_buffer = 0x8ce1;
  local_28.m_id = 0;
  local_28.m_texture_target = 0x806f;
  if (iVar2._M_current ==
      (this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_textures_info.
      super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>>
    ::_M_realloc_insert<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo_const&>
              ((vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>>
                *)this_00,iVar2,&local_28);
  }
  else {
    (iVar2._M_current)->m_depth = 4;
    (iVar2._M_current)->m_draw_buffer = 0x8ce1;
    (iVar2._M_current)->m_id = 0;
    (iVar2._M_current)->m_texture_target = 0x806f;
    ppTVar1 = &(this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_textures_info.
               super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
  (this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_draw_mode = 0;
  (this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_n_points = 1;
  (this->super_GeometryShaderLayeredRenderingBoundaryCondition).m_is_fbo_layered = true;
  return;
}

Assistant:

GeometryShaderLayeredRenderingBoundaryConditionVariousTextures::
	GeometryShaderLayeredRenderingBoundaryConditionVariousTextures(Context& context, const ExtParameters& extParams,
																   const char* name, const char* description)
	: GeometryShaderLayeredRenderingBoundaryCondition(context, extParams, name, description)
{
	TextureInfo texInfo;

	texInfo.m_depth			 = 2;
	texInfo.m_draw_buffer	= GL_COLOR_ATTACHMENT0;
	texInfo.m_id			 = 0;
	texInfo.m_texture_target = GL_TEXTURE_3D;

	m_textures_info.push_back(texInfo);

	texInfo.m_depth			 = 4;
	texInfo.m_draw_buffer	= GL_COLOR_ATTACHMENT1;
	texInfo.m_id			 = 0;
	texInfo.m_texture_target = GL_TEXTURE_3D;

	m_textures_info.push_back(texInfo);

	m_draw_mode		 = GL_POINTS;
	m_n_points		 = 1;
	m_is_fbo_layered = true;
}